

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

string * strToUpperCase(string *__return_storage_ptr__,string *src)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)src);
  __first._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CaseChanger<std::__cxx11::string>>
            (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(__first._M_current + __return_storage_ptr__->_M_string_length),__first,
             (CaseChanger<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )0x1);
  return __return_storage_ptr__;
}

Assistant:

string strToUpperCase(const string& src)
{
    string res = src;

    transform(res.begin(), res.end(), res.begin(), CaseChanger<string>(CaseType::ctUpper));

    return res;
}